

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall AST::AST(AST *this,string *filename)

{
  size_t *psVar1;
  bool bVar2;
  ostream *poVar3;
  GLRP *pGVar4;
  GLRParser *this_00;
  streambuf *psVar5;
  size_type sVar6;
  runtime_error *this_01;
  iterator __first;
  iterator __last;
  reference psVar7;
  ASTree *this_02;
  reference ppPVar8;
  string *psVar9;
  string local_518;
  uint local_4f4;
  undefined1 local_4f0 [8];
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> productions;
  iterator __end2;
  iterator __begin2;
  set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
  *__range2;
  int i;
  undefined1 local_470 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nonTerminals;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  glrNonTerminals;
  set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
  parsedVersions;
  string parseString;
  stringstream local_3b0 [8];
  stringstream buffer;
  ostream local_3a0 [376];
  undefined1 local_228 [8];
  ifstream t;
  GLRParser *glrParser;
  string *filename_local;
  AST *this_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Creating an AST for ");
  poVar3 = std::operator<<(poVar3,(string *)filename);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pGVar4 = GLRP::getInstance();
  bVar2 = GLRP::isLoaded(pGVar4);
  if (!bVar2) {
    pGVar4 = GLRP::getInstance();
    GLRP::loadParser(pGVar4);
  }
  pGVar4 = GLRP::getInstance();
  this_00 = GLRP::getGlrParser(pGVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"Parsing string...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ifstream::ifstream(local_228,(string *)filename,_S_in);
  std::__cxx11::stringstream::stringstream(local_3b0);
  psVar5 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_3a0,psVar5);
  std::__cxx11::stringstream::str();
  GLRParser::parseString
            ((set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
              *)&glrNonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,this_00,
             (string *)&parsedVersions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  poVar3 = std::operator<<((ostream *)&std::cout,"Done parsing");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  sVar6 = std::
          set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
          ::size((set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
                  *)&glrNonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (sVar6 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error parsing: Incorrect code");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Parsing error");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar6 = std::
          set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
          ::size((set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
                  *)&glrNonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (1 < sVar6) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Error parsing: Code has ambiguities, taking the first one");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  GLRParser::getNonTerminalsV_abi_cxx11_
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count,this_00);
  psVar1 = &nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __first = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)psVar1);
  __last = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)psVar1);
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  set<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)local_470,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__first._M_node,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__last._M_node);
  psVar1 = &glrNonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end2 = std::
           set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
           ::begin((set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
                    *)psVar1);
  productions.c.super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)
       std::
       set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
       ::end((set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
              *)psVar1);
  while( true ) {
    bVar2 = std::operator!=(&__end2,(_Self *)&productions.c.
                                              super__Deque_base<Production_*,_std::allocator<Production_*>_>
                                              ._M_impl.super__Deque_impl_data._M_finish._M_node);
    if (!bVar2) break;
    psVar7 = std::
             _Rb_tree_const_iterator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
             ::operator*(&__end2);
    std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>::stack
              ((stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *)
               local_4f0,psVar7);
    bVar2 = std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>::
            empty((stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *)
                  local_4f0);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error: Empty productions");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      this_02 = (ASTree *)operator_new(0x40);
      ppPVar8 = std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>::
                top((stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *
                    )local_4f0);
      psVar9 = Production::getFromP_abi_cxx11_(*ppPVar8);
      std::__cxx11::string::string((string *)&local_518,(string *)psVar9);
      ASTree::ASTree(this_02,(stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
                              *)local_4f0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_470,&local_518,(ASTree *)0x0);
      this->ast = this_02;
      std::__cxx11::string::~string((string *)&local_518);
    }
    local_4f4 = (uint)bVar2;
    std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>::~stack
              ((stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *)
               local_4f0);
    if (local_4f4 != 0) goto LAB_0010ed21;
    std::
    _Rb_tree_const_iterator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>
    ::operator++(&__end2);
  }
  local_4f4 = 0;
LAB_0010ed21:
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_470);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (local_4f4 == 0) {
    local_4f4 = 0;
  }
  std::
  set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
  ::~set((set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
          *)&glrNonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string
            ((string *)&parsedVersions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::stringstream::~stringstream(local_3b0);
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

AST::AST(std::string filename) {

    std::cout << "Creating an AST for " << filename << std::endl;

    if (!GLRP::getInstance().isLoaded()) {
        GLRP::getInstance().loadParser();
    }
    GLRParser *glrParser = GLRP::getInstance().getGlrParser();

//      glrParser->toDot("output/glrParser.dot");

    std::cout << "Parsing string..." << std::endl;

    // Get the contents of the file (Source: https://stackoverflow.com/questions/2602013/read-whole-ascii-file-into-c-stdstring)
    std::ifstream t(filename);
    std::stringstream buffer;
    buffer << t.rdbuf();
    std::string parseString = buffer.str();

    // Parse the contents of the file
    std::set<std::stack<Production *>> parsedVersions = glrParser->parseString(parseString);

    std::cout << "Done parsing" << std::endl;


    // Analyze the result of the parsing
    if (parsedVersions.size() == 0) {
        // No possible parse combinations found
        std::cerr << "Error parsing: Incorrect code" << std::endl;
        throw std::runtime_error("Parsing error");
    } else {

        if (parsedVersions.size() > 1) {
            // Multiple parse combinations possible
            std::cerr << "Error parsing: Code has ambiguities, taking the first one" << std::endl;
        }

        // One unique parse combination found

        // Transform the vector of nonTerminals in a set (Source: https://www.techiedelight.com/convert-vector-set-cpp/)
        std::set<std::string> glrNonTerminals = glrParser->getNonTerminalsV();
        std::set<std::string> nonTerminals(glrNonTerminals.begin(), glrNonTerminals.end());

//        // Get the only element in the set
//        std::stack<Production *> productions = *(parsedVersions.begin());

        int i = 0;
        for (auto productions: parsedVersions) {
            if (productions.empty()) {
                std::cerr << "Error: Empty productions" << std::endl;
                return;
            }
            // Create an ASTree with this list of productions
            ast = new ASTree(productions, nonTerminals, productions.top()->getFromP(), nullptr);
//            filename = "output/parsed" + std::to_string(i) + ".dot";
//            ast->toDot(filename);
            i++;
        }
    }
}